

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_acquire(green_future_t future)

{
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (0 < future->refs) {
    future->refs = future->refs + 1;
    return 0;
  }
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,0x237);
  fflush(_stderr);
  abort();
}

Assistant:

int green_future_acquire(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    ++future->refs;
    return GREEN_SUCCESS;
}